

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knowledge_dynamics.cc
# Opt level: O0

int explode::knowledge_dynamics::accept(int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined4 in_register_0000003c;
  char local_23;
  char local_22;
  char local_21;
  input *piStack_20;
  uint8_t bytes [3];
  input *f;
  input_exe_file *inp_local;
  
  piStack_20 = input_exe_file::file((input_exe_file *)CONCAT44(in_register_0000003c,__fd));
  (*piStack_20->_vptr_input[5])(piStack_20,0x200);
  (*piStack_20->_vptr_input[2])(piStack_20,&local_23,3);
  if (((local_23 == -0x17) && (local_22 == -0x67)) && (local_21 == '\0')) {
    inp_local._7_1_ = 1;
  }
  else {
    inp_local._7_1_ = 0;
  }
  return (uint)inp_local._7_1_;
}

Assistant:

bool knowledge_dynamics::accept(input_exe_file& inp)
  {
    input& f = inp.file();
    uint8_t bytes[3];
    f.seek(0x200);
    // e9 99 00
    f.read_buff(reinterpret_cast <char*>(bytes), 3);
    if (bytes[0] != 0xE9 || bytes[1] != 0x99 || bytes[2] != 0x00)
      {
	return false;
      }
    return true;
  }